

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.cc
# Opt level: O0

void search::movegen::addPawnMove(int from,int to,int cap,int side,MoveList *list,Board *pos)

{
  int iVar1;
  int local_2c;
  int i;
  Board *pos_local;
  MoveList *list_local;
  int side_local;
  int cap_local;
  int to_local;
  int from_local;
  
  if (board::Board::RANKS[board::Board::SQ64[from]] == *(int *)((long)&PAWN_RANK + (long)side * 4))
  {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      iVar1 = board::Move::MOVE(from,to,cap,
                                *(int *)(PROMOTION_PIECES + (long)local_2c * 4 + (long)side * 0x10),
                                0);
      addCaptureMove(iVar1,list,pos);
    }
  }
  else {
    iVar1 = board::Move::MOVE(from,to,cap,0,0);
    addCaptureMove(iVar1,list,pos);
  }
  return;
}

Assistant:

inline void search::movegen::addPawnMove(const int from, const int to, const int cap, const int side, MoveList& list,
                                         board::Board& pos)
{
    if (board::Board::RANKS[board::Board::SQ64[from]] == PAWN_RANK[side]) {
        for (int i = 0; i < 4; i++) {
            addCaptureMove(board::Move::MOVE(from, to, cap, PROMOTION_PIECES[side][i], 0), list, pos);
        }
    }
    else {
        addCaptureMove(board::Move::MOVE(from, to, cap, board::EMPTY, 0), list, pos);
    }
}